

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prio.c
# Opt level: O0

int main(void)

{
  FILE *pFVar1;
  int iVar2;
  int *piVar3;
  char *pcVar4;
  uint *puVar5;
  bool bVar6;
  undefined4 local_28;
  undefined4 local_24;
  int rcvprio;
  int sndprio;
  int pull2;
  int pull1;
  int push2;
  int push1;
  int rc;
  
  push1 = 0;
  sndprio = test_socket_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/prio.c"
                             ,0x2c,1,0x51);
  test_bind_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/prio.c"
                 ,0x2d,sndprio,"inproc://a");
  rcvprio = test_socket_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/prio.c"
                             ,0x2e,1,0x51);
  test_bind_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/prio.c"
                 ,0x2f,rcvprio,"inproc://b");
  pull1 = test_socket_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/prio.c"
                           ,0x30,1,0x50);
  local_24 = 1;
  push2 = nn_setsockopt(pull1,0,8,&local_24,4);
  pFVar1 = _stderr;
  if (push2 != 0) {
    piVar3 = __errno_location();
    pcVar4 = nn_err_strerror(*piVar3);
    puVar5 = (uint *)__errno_location();
    fprintf(pFVar1,"%s [%d] (%s:%d)\n",pcVar4,(ulong)*puVar5,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/prio.c",
            0x34);
    fflush(_stderr);
    nn_err_abort();
  }
  test_connect_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/prio.c"
                    ,0x35,pull1,"inproc://a");
  local_24 = 2;
  push2 = nn_setsockopt(pull1,0,8,&local_24,4);
  pFVar1 = _stderr;
  if (push2 != 0) {
    piVar3 = __errno_location();
    pcVar4 = nn_err_strerror(*piVar3);
    puVar5 = (uint *)__errno_location();
    fprintf(pFVar1,"%s [%d] (%s:%d)\n",pcVar4,(ulong)*puVar5,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/prio.c",
            0x39);
    fflush(_stderr);
    nn_err_abort();
  }
  test_connect_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/prio.c"
                    ,0x3a,pull1,"inproc://b");
  test_send_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/prio.c"
                 ,0x3c,pull1,"ABC");
  test_send_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/prio.c"
                 ,0x3d,pull1,"DEF");
  test_recv_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/prio.c"
                 ,0x3e,sndprio,"ABC");
  test_recv_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/prio.c"
                 ,0x3f,sndprio,"DEF");
  test_close_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/prio.c"
                  ,0x41,sndprio);
  test_close_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/prio.c"
                  ,0x42,pull1);
  test_close_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/prio.c"
                  ,0x43,rcvprio);
  pull1 = test_socket_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/prio.c"
                           ,0x47,1,0x50);
  test_bind_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/prio.c"
                 ,0x48,pull1,"inproc://a");
  pull2 = test_socket_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/prio.c"
                           ,0x49,1,0x50);
  test_bind_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/prio.c"
                 ,0x4a,pull2,"inproc://b");
  sndprio = test_socket_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/prio.c"
                             ,0x4b,1,0x51);
  local_28 = 2;
  push2 = nn_setsockopt(sndprio,0,9,&local_28,4);
  pFVar1 = _stderr;
  if (push2 != 0) {
    piVar3 = __errno_location();
    pcVar4 = nn_err_strerror(*piVar3);
    puVar5 = (uint *)__errno_location();
    fprintf(pFVar1,"%s [%d] (%s:%d)\n",pcVar4,(ulong)*puVar5,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/prio.c",
            0x4f);
    fflush(_stderr);
    nn_err_abort();
  }
  test_connect_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/prio.c"
                    ,0x50,sndprio,"inproc://a");
  local_28 = 1;
  push2 = nn_setsockopt(sndprio,0,9,&local_28,4);
  pFVar1 = _stderr;
  if (push2 != 0) {
    piVar3 = __errno_location();
    pcVar4 = nn_err_strerror(*piVar3);
    puVar5 = (uint *)__errno_location();
    fprintf(pFVar1,"%s [%d] (%s:%d)\n",pcVar4,(ulong)*puVar5,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/prio.c",
            0x54);
    fflush(_stderr);
    nn_err_abort();
  }
  test_connect_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/prio.c"
                    ,0x55,sndprio,"inproc://b");
  test_send_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/prio.c"
                 ,0x57,pull1,"ABC");
  test_send_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/prio.c"
                 ,0x58,pull2,"DEF");
  nn_sleep(100);
  test_recv_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/prio.c"
                 ,0x5a,sndprio,"DEF");
  test_recv_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/prio.c"
                 ,0x5b,sndprio,"ABC");
  test_close_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/prio.c"
                  ,0x5d,sndprio);
  test_close_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/prio.c"
                  ,0x5e,pull2);
  test_close_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/prio.c"
                  ,0x5f,pull1);
  pull1 = test_socket_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/prio.c"
                           ,99,1,0x50);
  test_bind_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/prio.c"
                 ,100,pull1,"inproc://a");
  sndprio = test_socket_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/prio.c"
                             ,0x65,1,0x51);
  test_connect_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/prio.c"
                    ,0x66,sndprio,"inproc://a");
  test_send_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/prio.c"
                 ,0x68,pull1,"ABC");
  test_recv_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/prio.c"
                 ,0x69,sndprio,"ABC");
  test_close_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/prio.c"
                  ,0x6a,sndprio);
  push2 = nn_send(pull1,"ABC",3,1);
  bVar6 = false;
  if (push2 == -1) {
    iVar2 = nn_errno();
    bVar6 = iVar2 == 0xb;
  }
  if (!bVar6) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == -1 && nn_errno() == EAGAIN",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/prio.c",
            0x6d);
    fflush(_stderr);
    nn_err_abort();
  }
  sndprio = test_socket_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/prio.c"
                             ,0x6f,1,0x51);
  test_connect_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/prio.c"
                    ,0x70,sndprio,"inproc://a");
  test_send_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/prio.c"
                 ,0x72,pull1,"ABC");
  test_recv_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/prio.c"
                 ,0x73,sndprio,"ABC");
  test_close_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/prio.c"
                  ,0x74,sndprio);
  test_close_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/prio.c"
                  ,0x75,pull1);
  return 0;
}

Assistant:

int main ()
{
    int rc;
    int push1;
    int push2;
    int pull1;
    int pull2;
    int sndprio;
    int rcvprio;

    /*  Test send priorities. */

    pull1 = test_socket (AF_SP, NN_PULL);
    test_bind (pull1, SOCKET_ADDRESS_A);
    pull2 = test_socket (AF_SP, NN_PULL);
    test_bind (pull2, SOCKET_ADDRESS_B);
    push1 = test_socket (AF_SP, NN_PUSH);
    sndprio = 1;
    rc = nn_setsockopt (push1, NN_SOL_SOCKET, NN_SNDPRIO,
        &sndprio, sizeof (sndprio));
    errno_assert (rc == 0);
    test_connect (push1, SOCKET_ADDRESS_A);
    sndprio = 2;
    rc = nn_setsockopt (push1, NN_SOL_SOCKET, NN_SNDPRIO,
        &sndprio, sizeof (sndprio));
    errno_assert (rc == 0);
    test_connect (push1, SOCKET_ADDRESS_B);

    test_send (push1, "ABC");
    test_send (push1, "DEF");
    test_recv (pull1, "ABC");
    test_recv (pull1, "DEF");

    test_close (pull1);
    test_close (push1);
    test_close (pull2);

    /*  Test receive priorities. */

    push1 = test_socket (AF_SP, NN_PUSH);
    test_bind (push1, SOCKET_ADDRESS_A);
    push2 = test_socket (AF_SP, NN_PUSH);
    test_bind (push2, SOCKET_ADDRESS_B);
    pull1 = test_socket (AF_SP, NN_PULL);
    rcvprio = 2;
    rc = nn_setsockopt (pull1, NN_SOL_SOCKET, NN_RCVPRIO,
        &rcvprio, sizeof (rcvprio));
    errno_assert (rc == 0);
    test_connect (pull1, SOCKET_ADDRESS_A);
    rcvprio = 1;
    rc = nn_setsockopt (pull1, NN_SOL_SOCKET, NN_RCVPRIO,
        &rcvprio, sizeof (rcvprio));
    errno_assert (rc == 0);
    test_connect (pull1, SOCKET_ADDRESS_B);

    test_send (push1, "ABC");
    test_send (push2, "DEF");
    nn_sleep (100);
    test_recv (pull1, "DEF");
    test_recv (pull1, "ABC");

    test_close (pull1);
    test_close (push2);
    test_close (push1);

    /*  Test removing a pipe from the list. */

    push1 = test_socket (AF_SP, NN_PUSH);
    test_bind (push1, SOCKET_ADDRESS_A);
    pull1 = test_socket (AF_SP, NN_PULL);
    test_connect (pull1, SOCKET_ADDRESS_A);

    test_send (push1, "ABC");
    test_recv (pull1, "ABC");
    test_close (pull1);

    rc = nn_send (push1, "ABC", 3, NN_DONTWAIT);
    nn_assert (rc == -1 && nn_errno() == EAGAIN);

    pull1 = test_socket (AF_SP, NN_PULL);
    test_connect (pull1, SOCKET_ADDRESS_A);

    test_send (push1, "ABC");
    test_recv (pull1, "ABC");
    test_close (pull1);
    test_close (push1);

    return 0;
}